

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_state_ptr lzham::lzham_lib_compress_init(lzham_compress_params *pParams)

{
  lzham_compress_state *plVar1;
  lzham_compress_status_t lVar2;
  uint uVar3;
  uint uVar4;
  lzham *this;
  lzham_compress_state *p;
  undefined1 *puVar5;
  int *in_RDI;
  lzham_compress_state *pState;
  lzham_malloc_context malloc_context;
  lzham_compress_status_t status;
  init_params internal_params;
  lzham_compress_params *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  init_params local_50;
  int *local_10;
  lzham_compress_state *local_8;
  
  if ((in_RDI == (int *)0x0) || (*in_RDI != 0x38)) {
    local_8 = (lzham_compress_state *)0x0;
  }
  else if (((uint)in_RDI[1] < 0xf) || (0x1d < (uint)in_RDI[1])) {
    local_8 = (lzham_compress_state *)0x0;
  }
  else {
    local_10 = in_RDI;
    lzcompressor::init_params::init_params(&local_50);
    uVar3 = (uint)local_10;
    lVar2 = create_internal_init_params
                      ((init_params *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa0);
    if (lVar2 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
      this = (lzham *)lzham::lzham_create_malloc_context((lzham *)0x0,uVar3);
      puVar5 = &stack0xffffffffffffffa0;
      p = lzham_new<lzham::lzham_compress_state,void*>
                    ((lzham_malloc_context)CONCAT44(lVar2,in_stack_ffffffffffffffa8),(void **)this);
      if (p == (lzham_compress_state *)0x0) {
        lzham::lzham_destroy_malloc_context(this,puVar5);
        local_8 = (lzham_compress_state *)0x0;
      }
      else {
        memcpy(&p->m_params,local_10,0x38);
        p->m_pIn_buf = (uint8 *)0x0;
        p->m_pIn_buf_size = (size_t *)0x0;
        p->m_pOut_buf = (uint8 *)0x0;
        p->m_pOut_buf_size = (size_t *)0x0;
        p->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
        p->m_comp_data_ofs = 0;
        p->m_finished_compression = false;
        plVar1 = (lzham_compress_state *)local_50.m_pTask_pool;
        if (local_50.m_max_helper_threads != 0) {
          uVar3 = task_pool::init(&p->m_tp,(EVP_PKEY_CTX *)(ulong)local_50.m_max_helper_threads);
          if ((uVar3 & 1) == 0) {
            lzham_delete<lzham::lzham_compress_state>(this,p);
            lzham::lzham_destroy_malloc_context(this,p);
            return (lzham_compress_state_ptr)0x0;
          }
          uVar4 = task_pool::get_num_threads(&p->m_tp);
          plVar1 = p;
          if (uVar4 < local_50.m_max_helper_threads) {
            local_50.m_max_helper_threads = 0;
            plVar1 = (lzham_compress_state *)local_50.m_pTask_pool;
          }
        }
        local_50.m_pTask_pool = &plVar1->m_tp;
        uVar3 = lzcompressor::init(&p->m_compressor,(EVP_PKEY_CTX *)&local_50);
        local_8 = p;
        if ((uVar3 & 1) == 0) {
          lzham_delete<lzham::lzham_compress_state>(this,p);
          lzham::lzham_destroy_malloc_context(this,p);
          local_8 = (lzham_compress_state *)0x0;
        }
      }
    }
    else {
      local_8 = (lzham_compress_state *)0x0;
    }
  }
  return local_8;
}

Assistant:

lzham_compress_state_ptr LZHAM_CDECL lzham_lib_compress_init(const lzham_compress_params *pParams)
   {
      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_compress_params)))
      {
         LZHAM_LOG_ERROR(6004);
         return NULL;
      }

      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
      {
         LZHAM_LOG_ERROR(6005);
         return NULL;
      }

      lzcompressor::init_params internal_params;
      lzham_compress_status_t status = create_internal_init_params(internal_params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
      {
         LZHAM_LOG_ERROR(6006);
         return NULL;
      }

      lzham_malloc_context malloc_context = lzham_create_malloc_context(0);

      lzham_compress_state *pState = lzham_new<lzham_compress_state>(malloc_context, malloc_context);
      if (!pState)
      {
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6007);
         return NULL;
      }

      pState->m_params = *pParams;

      pState->m_pIn_buf = NULL;
      pState->m_pIn_buf_size = NULL;
      pState->m_pOut_buf = NULL;
      pState->m_pOut_buf_size = NULL;
      pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
      pState->m_comp_data_ofs = 0;
      pState->m_finished_compression = false;

      if (internal_params.m_max_helper_threads)
      {
         if (!pState->m_tp.init(internal_params.m_max_helper_threads))
         {
            lzham_delete(malloc_context, pState);
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6008);
            return NULL;
         }
         if (pState->m_tp.get_num_threads() >= internal_params.m_max_helper_threads)
         {
            internal_params.m_pTask_pool = &pState->m_tp;
         }
         else
         {
            internal_params.m_max_helper_threads = 0;
         }
      }

      if (!pState->m_compressor.init(internal_params))
      {
         lzham_delete(malloc_context, pState);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6009);
         return NULL;
      }

      return pState;
   }